

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O2

int __thiscall CDemoPlayer::ReadChunkHeader(CDemoPlayer *this,int *pType,int *pSize,int *pTick)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  long in_FS_OFFSET;
  uchar Chunk;
  uchar aSizeData [1];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Chunk = '\0';
  *pSize = 0;
  *pType = 0;
  uVar2 = io_read(this->m_File,&Chunk,1);
  iVar3 = -1;
  if (uVar2 != 1) goto LAB_0012e58b;
  uVar2 = (uint)Chunk;
  if ((char)Chunk < '\0') {
    *pType = uVar2 & 0xffffffc0;
    if ((Chunk & 0x3f) == 0) {
      uVar2 = io_read(this->m_File,aSizeData,4);
      if (uVar2 != 4) goto LAB_0012e58b;
      iVar3 = bytes_be_to_int(aSizeData);
      *pTick = iVar3;
    }
    else {
      *pTick = *pTick + (uVar2 & 0x3f);
    }
  }
  else {
    *pType = (uint)(Chunk >> 5);
    *pSize = uVar2 & 0x1f;
    if ((~Chunk & 0x1f) == 0) {
      uVar2 = io_read(this->m_File,aSizeData,2);
      if (uVar2 != 2) goto LAB_0012e58b;
      uVar2 = (uint)_aSizeData;
    }
    else {
      if ((uVar2 & 0x1f) != 0x1e) goto LAB_0012e589;
      uVar2 = io_read(this->m_File,aSizeData,1);
      if (uVar2 != 1) goto LAB_0012e58b;
      uVar2 = (uint)aSizeData[0];
    }
    *pSize = uVar2;
  }
LAB_0012e589:
  iVar3 = 0;
LAB_0012e58b:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int CDemoPlayer::ReadChunkHeader(int *pType, int *pSize, int *pTick)
{
	unsigned char Chunk = 0;

	*pSize = 0;
	*pType = 0;

	if(io_read(m_File, &Chunk, sizeof(Chunk)) != sizeof(Chunk))
		return -1;

	if(Chunk&CHUNKTYPEFLAG_TICKMARKER)
	{
		// decode tick marker
		int Tickdelta = Chunk&(CHUNKMASK_TICK);
		*pType = Chunk&(CHUNKTYPEFLAG_TICKMARKER|CHUNKTICKFLAG_KEYFRAME);

		if(Tickdelta == 0)
		{
			unsigned char aTickData[4];
			if(io_read(m_File, aTickData, sizeof(aTickData)) != sizeof(aTickData))
				return -1;
			*pTick = bytes_be_to_int(aTickData);
		}
		else
		{
			*pTick += Tickdelta;
		}
	}
	else
	{
		// decode normal chunk
		*pType = (Chunk&CHUNKMASK_TYPE)>>5;
		*pSize = Chunk&CHUNKMASK_SIZE;

		if(*pSize == 30)
		{
			unsigned char aSizeData[1];
			if(io_read(m_File, aSizeData, sizeof(aSizeData)) != sizeof(aSizeData))
				return -1;
			*pSize = aSizeData[0];
		}
		else if(*pSize == 31)
		{
			unsigned char aSizeData[2];
			if(io_read(m_File, aSizeData, sizeof(aSizeData)) != sizeof(aSizeData))
				return -1;
			*pSize = (aSizeData[1]<<8) | aSizeData[0];
		}
	}

	return 0;
}